

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

hugeint_t duckdb::Cast::Operation<long,duckdb::hugeint_t>(long input)

{
  bool bVar1;
  undefined1 auVar2 [16];
  hugeint_t result;
  string local_38;
  
  bVar1 = TryCast::Operation<long,duckdb::hugeint_t>(input,&result,false);
  if (bVar1) {
    return result;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,duckdb::hugeint_t>(&local_38,(duckdb *)input,auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}